

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O3

bool IsCpmDirEntry(uint8_t *pb_)

{
  long lVar1;
  bool bVar2;
  
  bVar2 = true;
  if (*pb_ != 0xe5) {
    if (((0x21 < *pb_) || (pb_[0x10] == '\0')) || (pb_[0xf] == '\0')) {
      return false;
    }
    lVar1 = 1;
    do {
      if ((pb_[lVar1] & 0x60) == 0) {
        return false;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xc);
    bVar2 = -1 < (char)pb_[8];
  }
  return bVar2;
}

Assistant:

bool IsCpmDirEntry(const uint8_t* pb_)
{
    auto p = reinterpret_cast<const CPM_DIR*>(pb_);

    // Accept unused entries without looking further
    if (p->user == 0xe5)
        return true;

    // Reject unknown user values
    if (p->user > 0x21)
        return false;

    // Must be at least one valid block in size
    if (!p->blocks[0] || !p->rc)
        return false;

    // CPC special case - allow entries with a 2nd character of 6, used for some fancy effects
//  if (p->file[1] != 0x06)
    {
        // Ensure the file+ext are normal ASCII characters (ignoring bit 7)     illegal: !&()+,-./:;<=>[\]|
        for (size_t i = 0; i < sizeof(p->file) + sizeof(p->ext); ++i)
            if ((p->file[i] & 0x7f) < 0x20)
                return false;
    }

    // Ensure b7 of [7] is clear. b7 of [5] means hidden, b7 of [6] means read-only.
    // See http://cpctech.cpc-live.com/docs/catalog.html for details.
    if (p->file[7] & 0x80)
        return false;

    // Seems valid
    return true;
}